

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_store_tx(MACROBLOCKD *xd,int row,int col,TX_SIZE tx_size,BLOCK_SIZE bsize)

{
  undefined1 in_CL;
  int in_EDX;
  int in_ESI;
  MACROBLOCKD *in_RDI;
  byte in_R8B;
  int unaff_retaddr;
  uint8_t *dst;
  macroblockd_plane *pd;
  CFL_CTX *cfl;
  macroblockd_plane *pmVar1;
  CFL_CTX *cfl_00;
  undefined6 in_stack_ffffffffffffffe8;
  
  cfl_00 = &in_RDI->cfl;
  pmVar1 = in_RDI->plane;
  if ((block_size_high[in_R8B] == '\x04') || (block_size_wide[in_R8B] == '\x04')) {
    sub8x8_adjust_offset
              (cfl_00,in_RDI->mi_row,in_RDI->mi_col,(int *)&stack0xfffffffffffffff4,
               (int *)&stack0xfffffffffffffff0);
  }
  is_cur_buf_hbd(in_RDI);
  cfl_store((CFL_CTX *)CONCAT44(in_ESI,in_EDX),
            (uint8_t *)CONCAT17(in_CL,CONCAT16(in_R8B,in_stack_ffffffffffffffe8)),
            (int)((ulong)cfl_00 >> 0x20),(int)cfl_00,(int)((ulong)pmVar1 >> 0x20),
            (TX_SIZE)((ulong)pmVar1 >> 0x18),unaff_retaddr);
  return;
}

Assistant:

void cfl_store_tx(MACROBLOCKD *const xd, int row, int col, TX_SIZE tx_size,
                  BLOCK_SIZE bsize) {
  CFL_CTX *const cfl = &xd->cfl;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  uint8_t *dst = &pd->dst.buf[(row * pd->dst.stride + col) << MI_SIZE_LOG2];

  if (block_size_high[bsize] == 4 || block_size_wide[bsize] == 4) {
    // Only dimensions of size 4 can have an odd offset.
    assert(!((col & 1) && tx_size_wide[tx_size] != 4));
    assert(!((row & 1) && tx_size_high[tx_size] != 4));
    sub8x8_adjust_offset(cfl, xd->mi_row, xd->mi_col, &row, &col);
  }
  cfl_store(cfl, dst, pd->dst.stride, row, col, tx_size, is_cur_buf_hbd(xd));
}